

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O2

void __thiscall CProficiencies::ListKnownProficiencies(CProficiencies *this,char_data *player)

{
  PC_DATA *pPVar1;
  pointer pbVar2;
  size_type sVar3;
  char_data *this_00;
  CProficiencies *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  int i;
  long lVar4;
  pointer pbVar5;
  string_view fmt;
  format_args args;
  string_view fmt_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  responseList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> response;
  string profStr;
  
  if (player != (char_data *)0x0) {
    responseList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    responseList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    responseList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    this_00 = player;
    for (lVar4 = 0; lVar4 != 0x19; lVar4 = lVar4 + 1) {
      if (-1 < this->profs[lVar4]) {
        GetProficiency((proficiency_type *)&response,(CProficiencies *)this_00,(int)lVar4);
        sVar3 = response._M_string_length;
        pPVar1 = this->ch->pcdata;
        if (pPVar1 == (PC_DATA *)0x0) {
          this_01 = &prof_none;
        }
        else {
          this_01 = &pPVar1->profs;
        }
        response._M_dataplus._M_p = GetSkillLevelName(this_01,(int)lVar4);
        response.field_2._M_allocated_capacity = sVar3;
        fmt.size_ = 0xcc;
        fmt.data_ = (char *)0x13;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&response;
        ::fmt::v9::vformat_abi_cxx11_(&profStr,(v9 *)"You are {} at {}.\n\r",fmt,args);
        this_00 = (char_data *)&profStr;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&responseList,(value_type *)&profStr);
        std::__cxx11::string::~string((string *)&profStr);
      }
    }
    if (responseList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        responseList.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      send_to_char("You currently have no proficiencies.\n\r",player);
    }
    else {
      send_to_char("Your proficiencies are:\n\r",player);
      pbVar2 = responseList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar5 = responseList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1
          ) {
        std::__cxx11::string::string((string *)&response,(string *)pbVar5);
        send_to_char(response._M_dataplus._M_p,player);
        std::__cxx11::string::~string((string *)&response);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&responseList);
    return;
  }
  fmt_00._M_str = "CProficiencies::ListKnownProficiencies: Player is null.";
  fmt_00._M_len = 0x37;
  CLogger::Debug<>((CLogger *)&RS.field_0x140,fmt_00);
  return;
}

Assistant:

void CProficiencies::ListKnownProficiencies(char_data* player)
{
	if (player == nullptr)
	{
		RS.Logger.Debug("CProficiencies::ListKnownProficiencies: Player is null.");
		return;
	}

	std::vector<std::string> responseList;

	auto limit = std::size(profs);
	for (int i = 0; i < limit ; i++)
	{
		if(profs[i] < 0)
			continue;
		
		char* profName = ch->Profs()->GetProficiency(i).name;
		auto profStr = fmt::format("You are {} at {}.\n\r", ch->Profs()->GetSkillLevelName(i), profName);
		responseList.push_back(profStr);
	}

	if (responseList.empty())
	{
		send_to_char("You currently have no proficiencies.\n\r", player);
	}
	else
	{
		send_to_char("Your proficiencies are:\n\r", player);
		for (auto response : responseList)
		{
			send_to_char(response.c_str(), player);
		}
	}	
}